

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadSmt.c
# Opt level: O0

char * Smt_GetHexFromDecimalString(char *pStr)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  size_t sVar7;
  Vec_Int_t *p;
  Vec_Int_t *p_00;
  char *pcVar8;
  char local_4d;
  char letter;
  int number;
  char *hex;
  int nBits;
  Vec_Int_t *rev;
  Vec_Int_t *decimal;
  int metNonZeroBit;
  int carry;
  int digit;
  int nDigits;
  int k;
  int i;
  char *pStr_local;
  
  digit = 0;
  sVar7 = strlen(pStr);
  iVar3 = (int)sVar7;
  decimal._4_4_ = 0;
  bVar1 = false;
  p = Vec_IntAlloc(iVar3);
  for (nDigits = 0; nDigits < iVar3; nDigits = nDigits + 1) {
    Vec_IntPush(p,pStr[nDigits] + -0x30);
  }
  p_00 = Vec_IntAlloc(10);
  while (digit < iVar3) {
    iVar2 = Vec_IntEntry(p,digit);
    if ((iVar2 == 0) && (decimal._4_4_ == 0)) {
      digit = digit + 1;
      if (iVar3 <= digit) {
        if (!bVar1) break;
        Vec_IntPush(p_00,0);
        decimal._4_4_ = 0;
        digit = 0;
        bVar1 = false;
      }
    }
    else {
      if (!bVar1) {
        bVar1 = true;
      }
      iVar2 = decimal._4_4_ * 10 + iVar2;
      decimal._4_4_ = iVar2 % 2;
      Vec_IntWriteEntry(p,digit,iVar2 / 2);
      digit = digit + 1;
      if (iVar3 <= digit) {
        Vec_IntPush(p_00,decimal._4_4_);
        decimal._4_4_ = 0;
        digit = 0;
        bVar1 = false;
      }
    }
  }
  Vec_IntFree(p);
  iVar3 = Vec_IntSize(p_00);
  if (iVar3 == 0) {
    Vec_IntPush(p_00,0);
  }
  while (iVar3 = Vec_IntSize(p_00), iVar3 % 4 != 0) {
    Vec_IntPush(p_00,0);
  }
  iVar3 = Vec_IntSize(p_00);
  pcVar8 = (char *)malloc((long)(iVar3 / 4 + 1));
  for (digit = 0; digit < iVar3 / 4; digit = digit + 1) {
    iVar2 = Vec_IntEntry(p_00,digit << 2);
    iVar4 = Vec_IntEntry(p_00,digit * 4 + 1);
    iVar5 = Vec_IntEntry(p_00,digit * 4 + 2);
    iVar6 = Vec_IntEntry(p_00,digit * 4 + 3);
    switch(iVar2 + iVar4 * 2 + iVar5 * 4 + iVar6 * 8) {
    case 0:
      local_4d = '0';
      break;
    case 1:
      local_4d = '1';
      break;
    case 2:
      local_4d = '2';
      break;
    case 3:
      local_4d = '3';
      break;
    case 4:
      local_4d = '4';
      break;
    case 5:
      local_4d = '5';
      break;
    case 6:
      local_4d = '6';
      break;
    case 7:
      local_4d = '7';
      break;
    case 8:
      local_4d = '8';
      break;
    case 9:
      local_4d = '9';
      break;
    case 10:
      local_4d = 'a';
      break;
    case 0xb:
      local_4d = 'b';
      break;
    case 0xc:
      local_4d = 'c';
      break;
    case 0xd:
      local_4d = 'd';
      break;
    case 0xe:
      local_4d = 'e';
      break;
    case 0xf:
      local_4d = 'f';
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcReadSmt.c"
                    ,0x23a,"char *Smt_GetHexFromDecimalString(char *)");
    }
    pcVar8[(iVar3 / 4 + -1) - digit] = local_4d;
  }
  pcVar8[iVar3 / 4] = '\0';
  Vec_IntFree(p_00);
  return pcVar8;
}

Assistant:

static inline char * Smt_GetHexFromDecimalString(char * pStr)
{
    int i,k=0, nDigits = strlen(pStr);
    int digit, carry = 0;
    int metNonZeroBit = 0;
    
    Vec_Int_t * decimal = Vec_IntAlloc(nDigits);
    Vec_Int_t * rev;
    int nBits;
    char * hex;
    
    for (i=0;i<nDigits;i++)
        Vec_IntPush(decimal,pStr[i]-'0');

    // firstly fillin the reversed vector
    rev = Vec_IntAlloc(10);
    while(k<nDigits)
    {
        digit = Vec_IntEntry(decimal,k);
        if (!digit && !carry)
        {
            k++;
            if (k>=nDigits)
            {
                if (!metNonZeroBit)
                    break;
                else
                {
                    Vec_IntPush(rev,carry);
                    carry = 0;
                    k = 0;
                    metNonZeroBit = 0;
                }
            }
            continue;
        }
        
        if (!metNonZeroBit)
            metNonZeroBit = 1;

        digit = carry*10 + digit;
        carry = digit%2;
        digit = digit / 2;
        Vec_IntWriteEntry(decimal,k,digit);

        k++;
        if (k>=nDigits)
        {
            Vec_IntPush(rev,carry);   
            carry = 0; 
            k = 0;
            metNonZeroBit = 0;
        }
    }
    
    Vec_IntFree(decimal);
    
    if (!Vec_IntSize(rev))
        Vec_IntPush(rev,0);

    while (Vec_IntSize(rev)%4)
        Vec_IntPush(rev,0);
    
    nBits = Vec_IntSize(rev);
    hex = (char *)malloc((nBits/4+1)*sizeof(char));
 
    for (k=0;k<nBits/4;k++)
    {   
        int number = Vec_IntEntry(rev,k*4) + 2*Vec_IntEntry(rev,k*4+1) + 4*Vec_IntEntry(rev,k*4+2) + 8*Vec_IntEntry(rev,k*4+3);
        char letter;

        switch(number) {
            case 0: letter = '0'; break;
            case 1: letter = '1'; break;
            case 2: letter = '2'; break;
            case 3: letter = '3'; break;
            case 4: letter = '4'; break;
            case 5: letter = '5'; break;
            case 6: letter = '6'; break;
            case 7: letter = '7'; break;
            case 8: letter = '8'; break;
            case 9: letter = '9'; break;
            case 10: letter = 'a'; break;
            case 11: letter = 'b'; break;
            case 12: letter = 'c'; break;
            case 13: letter = 'd'; break;
            case 14: letter = 'e'; break;
            case 15: letter = 'f'; break;
            default: assert(0);
        }
        hex[nBits/4-1-k] = letter;
        //if (k<Vec_IntSize(rev))
        //    Vec_IntPush(vFanins,Vec_IntEntry(rev,k));
        //else
        //    Vec_IntPush(vFanins,0);
    }
    hex[nBits/4] = '\0';
    Vec_IntFree(rev);

    return hex;
}